

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateManager.cpp
# Opt level: O1

Input * __thiscall
helics::ValueFederateManager::getInputByTarget(ValueFederateManager *this,string_view key)

{
  bool bVar1;
  long lVar2;
  int iVar3;
  Input **ppIVar4;
  pthread_rwlock_t *__rwlock;
  bool bVar5;
  pair<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>_>,_std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>_>_>
  pVar6;
  handle inps;
  BlockIterator<helics::Input,_32,_helics::Input_**> ret;
  undefined1 local_68 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  BlockIterator<helics::Input,_32,_helics::Input_**> local_48;
  
  bVar1 = (this->targetIDs).enabled;
  if (bVar1 == true) {
    __rwlock = (pthread_rwlock_t *)&(this->targetIDs).m_mutex;
    std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)&__rwlock->__data);
  }
  else {
    __rwlock = (pthread_rwlock_t *)0x0;
  }
  local_68._0_8_ = &local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_68,key._M_str,key._M_str + key._M_len);
  pVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>_>_>
          ::equal_range((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>_>_>
                         *)&this->targetIDs,(key_type *)local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._0_8_ != &local_58) {
    operator_delete((void *)local_68._0_8_,local_58._M_allocated_capacity + 1);
  }
  if (pVar6.first._M_node._M_node != pVar6.second._M_node._M_node) {
    gmlc::libguarded::
    shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
    ::lock((handle *)local_68,&this->inputs);
    gmlc::containers::
    DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>::find
              (&local_48,
               (DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>
                *)local_68._0_8_,(InterfaceHandle *)(pVar6.first._M_node._M_node + 2));
    iVar3 = *(int *)(local_68._0_8_ + 0x18);
    lVar2 = *(long *)(local_68._0_8_ + 8);
    if (iVar3 == 0x20) {
      if (lVar2 == 0) {
        ppIVar4 = &gmlc::containers::
                   StableBlockVector<helics::Input,_5U,_std::allocator<helics::Input>_>::end::
                   emptyValue;
      }
      else {
        ppIVar4 = (Input **)(lVar2 + ((long)*(int *)(local_68._0_8_ + 0x14) + 1) * 8);
      }
      iVar3 = 0;
    }
    else {
      ppIVar4 = (Input **)(lVar2 + (long)*(int *)(local_68._0_8_ + 0x14) * 8);
    }
    if ((ppIVar4 == local_48.vec) ||
       ((((bVar5 = true, local_48.vec != (Input **)0x0 && (ppIVar4 != (Input **)0x0)) &&
         (*local_48.vec == (Input *)0x0)) && (*ppIVar4 == (Input *)0x0)))) {
      bVar5 = iVar3 != local_48.offset;
    }
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)(local_68 + 8));
    if (bVar5) goto LAB_001ffa67;
  }
  local_48.ptr = (Input *)invalidIptNC;
LAB_001ffa67:
  if (bVar1 != false) {
    pthread_rwlock_unlock(__rwlock);
  }
  return local_48.ptr;
}

Assistant:

Input& ValueFederateManager::getInputByTarget(std::string_view key)
{
    auto TIDhandle = targetIDs.lock_shared();
    auto res = TIDhandle->equal_range(std::string(key));
    if (res.first != res.second) {
        auto inps = inputs.lock();
        auto ret = inps->find(res.first->second);
        if (ret != inps->end()) {
            return *ret;
        }
    }
    return invalidIptNC;
}